

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int MakeInputImageCopy(VP8LEncoder *enc)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long in_RDI;
  int y;
  uint32_t *src;
  uint32_t *dst;
  int height;
  int width;
  WebPPicture *picture;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 local_4;
  
  lVar3 = *(long *)(in_RDI + 8);
  iVar1 = *(int *)(lVar3 + 8);
  iVar2 = *(int *)(lVar3 + 0xc);
  iVar4 = AllocateTransformBuffer(_height,dst._4_4_,(int)dst);
  if (iVar4 == 0) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x18) == 1) {
    local_4 = 1;
  }
  else {
    local_28 = *(void **)(in_RDI + 0x10);
    local_30 = *(void **)(lVar3 + 0x48);
    for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
      memcpy(local_28,local_30,(long)iVar1 << 2);
      local_28 = (void *)((long)local_28 + (long)iVar1 * 4);
      local_30 = (void *)((long)local_30 + (long)*(int *)(lVar3 + 0x50) * 4);
    }
    *(undefined4 *)(in_RDI + 0x18) = 1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int MakeInputImageCopy(VP8LEncoder* const enc) {
  const WebPPicture* const picture = enc->pic;
  const int width = picture->width;
  const int height = picture->height;

  if (!AllocateTransformBuffer(enc, width, height)) return 0;
  if (enc->argb_content == kEncoderARGB) return 1;

  {
    uint32_t* dst = enc->argb;
    const uint32_t* src = picture->argb;
    int y;
    for (y = 0; y < height; ++y) {
      memcpy(dst, src, width * sizeof(*dst));
      dst += width;
      src += picture->argb_stride;
    }
  }
  enc->argb_content = kEncoderARGB;
  assert(enc->current_width == width);
  return 1;
}